

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfok.c
# Opt level: O3

err_t pfokDH(octet *sharekey,pfok_params *params,octet *privkey,octet *pubkey)

{
  u64 *dest;
  qr_o *r;
  bool_t bVar1;
  int iVar2;
  ulong m;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  u64 *dest_00;
  void *stack;
  word wVar6;
  ulong uVar7;
  ulong count;
  ulong uVar8;
  ulong n;
  err_t eVar9;
  
  bVar1 = memIsValid(params,0x2f8);
  eVar9 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = pfokParamsIsOperable(params);
    if (bVar1 == 0) {
      eVar9 = 0x1f6;
    }
    else {
      sVar3 = params->l;
      sVar4 = params->r;
      uVar8 = sVar4 + 7 >> 3;
      bVar1 = memIsValid(privkey,uVar8);
      if (bVar1 != 0) {
        count = sVar3 + 7 >> 3;
        bVar1 = memIsValid(pubkey,count);
        if ((bVar1 != 0) && (bVar1 = memIsValid(sharekey,params->n + 7 >> 3), bVar1 != 0)) {
          n = sVar3 + 0x3f >> 6;
          uVar7 = sVar4 + 0x3f;
          m = uVar7 >> 6;
          sVar3 = zmMontCreate_keep(count);
          sVar4 = zmMontCreate_deep(count);
          sVar5 = zmMontCreate_deep(count);
          sVar5 = qrPower_deep(n,n,sVar5);
          sVar4 = utilMax(2,sVar4,sVar5);
          dest_00 = (u64 *)blobCreate(sVar3 + (m + n) * 8 + sVar4);
          if (dest_00 == (u64 *)0x0) {
            eVar9 = 0x6e;
          }
          else {
            dest = dest_00 + m;
            r = (qr_o *)(dest + n);
            sVar3 = zmMontCreate_keep(count);
            stack = (void *)((long)&(r->hdr).keep + sVar3);
            zmMontCreate(r,params->p,count,params->l + 2,stack);
            u64From(dest_00,privkey,uVar8);
            wVar6 = wwGetBits(dest_00,params->r,(uVar7 & 0xffffffffffffffc0) - params->r);
            eVar9 = 0x1f8;
            if (wVar6 == 0) {
              u64From(dest,pubkey,count);
              bVar1 = wwIsZero(dest,n);
              eVar9 = 0x1f9;
              if ((bVar1 == 0) && (iVar2 = wwCmp(dest,(word *)dest[n + 3],n), iVar2 < 0)) {
                qrPower(dest,dest,dest_00,m,r,stack);
                (*r->to)((octet *)dest,dest,r,stack);
                memCopy(sharekey,dest,params->n + 7 >> 3);
                eVar9 = 0;
                uVar8 = params->n & 7;
                if (uVar8 != 0) {
                  sharekey[params->n >> 3] =
                       sharekey[params->n >> 3] & (byte)(0xff >> (8U - (char)uVar8 & 0x1f));
                }
              }
            }
            blobClose(dest_00);
          }
        }
      }
    }
  }
  return eVar9;
}

Assistant:

err_t pfokDH(octet sharekey[], const pfok_params* params, 
	const octet privkey[], const octet pubkey[])
{
	size_t n, no;
	size_t m, mo;
	// состояние
	void* state;
	word* x;				/* [m] личный ключ */
	word* y;				/* [n] открытый ключ визави */
	qr_o* qr;				/* описание кольца Монтгомери */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(pfok_params)))
		return ERR_BAD_INPUT;
	// работоспособные параметры?
	if (!pfokParamsIsOperable(params))
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// проверить остальные входные данные
	if (!memIsValid(privkey, mo) || 
		!memIsValid(pubkey, no) ||
		!memIsValid(sharekey, O_OF_B(params->n)))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(
		O_OF_W(n) + O_OF_W(m) + zmMontCreate_keep(no) +  
		utilMax(2,
			zmMontCreate_deep(no),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	x = (word*)state;
	y = x + m;
	qr = (qr_o*)(y + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// x <- privkey
	wwFrom(x, privkey, mo);
	if (wwGetBits(x, params->r, B_OF_W(m) - params->r) != 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// y <- pubkey
	wwFrom(y, pubkey, no);
	if (wwIsZero(y, n) || wwCmp(y, qr->mod, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	qrPower(y, y, x, m, qr, stack);
	// выгрузить открытый ключ
	qrTo((octet*)y, y, qr, stack);
	memCopy(sharekey, y, O_OF_B(params->n));
	if (params->n % 8)
		sharekey[params->n / 8] &= (octet)255 >> (8 - params->n % 8);
	// все нормально
	blobClose(state);
	return ERR_OK;
}